

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.h
# Opt level: O0

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::SurrogatePairTracker::
SurrogatePairTracker
          (SurrogatePairTracker *this,EncodedChar *location,EncodedChar *rangeLocation,
          codepoint_t value,uint32 length,size_t multiUnits)

{
  size_t multiUnits_local;
  uint32 length_local;
  codepoint_t value_local;
  EncodedChar *rangeLocation_local;
  EncodedChar *location_local;
  SurrogatePairTracker *this_local;
  
  this->location = location;
  this->rangeLocation = rangeLocation;
  this->value = value;
  this->length = length;
  this->multiUnits = multiUnits;
  this->next = (SurrogatePairTracker *)0x0;
  return;
}

Assistant:

SurrogatePairTracker(const EncodedChar* location, const EncodedChar* rangeLocation, codepoint_t value, uint32 length, size_t multiUnits)
                : location(location)
                , next(nullptr)
                , value(value)
                , length(length)
                , multiUnits(multiUnits)
                , rangeLocation(rangeLocation)
            {
            }